

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-splitting.cpp
# Opt level: O2

void __thiscall anon_func::CallIndirector::~CallIndirector(CallIndirector *this)

{
  ::wasm::WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>::
  ~WalkerPass(&this->
               super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
             );
  operator_delete(this,0x118);
  return;
}

Assistant:

CallIndirector(ModuleSplitter& parent)
      : parent(parent), builder(parent.primary) {}